

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O3

bool __thiscall
Fossilize::StreamArchive::get_hash_list_for_resource_tag
          (StreamArchive *this,ResourceTag tag,size_t *hash_count,Hash *hashes)

{
  ExportedMetadataHeader *pEVar1;
  size_t sVar2;
  ulong uVar3;
  _Hash_node_base *p_Var4;
  long lVar5;
  Hash *pHVar6;
  size_t sVar7;
  
  pEVar1 = this->imported_metadata;
  if (pEVar1 == (ExportedMetadataHeader *)0x0) {
    uVar3 = this->seen_blobs[tag]._M_h._M_element_count;
    if (hashes == (Hash *)0x0) {
      *hash_count = uVar3;
      return true;
    }
    if (uVar3 == *hash_count) {
      pHVar6 = hashes;
      for (p_Var4 = this->seen_blobs[tag]._M_h._M_before_begin._M_nxt;
          p_Var4 != (_Hash_node_base *)0x0; p_Var4 = p_Var4->_M_nxt) {
        *pHVar6 = (Hash)p_Var4[1]._M_nxt;
        pHVar6 = pHVar6 + 1;
      }
      if (uVar3 != 0) {
        lVar5 = 0x3f;
        if (uVar3 != 0) {
          for (; uVar3 >> lVar5 == 0; lVar5 = lVar5 + -1) {
          }
        }
        std::__introsort_loop<unsigned_long*,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (hashes,hashes + uVar3,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
        std::__final_insertion_sort<unsigned_long*,__gnu_cxx::__ops::_Iter_less_iter>
                  (hashes,hashes + uVar3);
        return true;
      }
      return true;
    }
  }
  else {
    sVar2 = pEVar1->lists[tag].count;
    if (hashes == (Hash *)0x0) {
      *hash_count = sVar2;
      return true;
    }
    if (sVar2 == *hash_count) {
      if (sVar2 != 0) {
        pHVar6 = (Hash *)((long)&((ExportedMetadataHeader *)(pEVar1->lists + -1))->magic +
                         pEVar1->lists[tag].offset);
        sVar7 = 0;
        do {
          hashes[sVar7] = *pHVar6;
          sVar7 = sVar7 + 1;
          pHVar6 = pHVar6 + 4;
        } while (sVar2 != sVar7);
        return true;
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool get_hash_list_for_resource_tag(ResourceTag tag, size_t *hash_count, Hash *hashes) override
	{
		if (imported_metadata)
		{
			size_t size = imported_metadata->lists[tag].count;
			if (hashes)
			{
				if (size != *hash_count)
					return false;
			}
			else
				*hash_count = size;

			if (hashes)
			{
				const auto *blocks = reinterpret_cast<const ExportedMetadataBlock *>(
						reinterpret_cast<const uint8_t *>(imported_metadata) + imported_metadata->lists[tag].offset);
				for (size_t i = 0; i < size; i++)
					hashes[i] = blocks[i].hash;
			}
		}
		else
		{
			size_t size = seen_blobs[tag].size();
			if (hashes)
			{
				if (size != *hash_count)
					return false;
			}
			else
				*hash_count = size;

			if (hashes)
			{
				Hash *iter = hashes;
				for (auto &blob : seen_blobs[tag])
					*iter++ = blob.first;

				// Make replay more deterministic.
				sort(hashes, hashes + size);
			}
		}

		return true;
	}